

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panel_code.cpp
# Opt level: O0

void copy_item_to_command_proc(Am_Object *panel_item,Am_Value *value)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *value_00;
  bool local_99;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object owners_cmd;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object owner;
  Am_Object command;
  Am_Object local_50;
  byte local_41;
  Am_Object local_40 [3];
  byte local_21;
  Am_Object local_20;
  Am_Value *local_18;
  Am_Value *value_local;
  Am_Object *panel_item_local;
  
  local_21 = 0;
  local_41 = 0;
  bVar2 = false;
  local_99 = false;
  local_18 = value;
  value_local = (Am_Value *)panel_item;
  if (value->type == 0xa001) {
    Am_Object::Am_Object(&local_20,value);
    local_21 = 1;
    bVar1 = Am_Object::Valid(&local_20);
    local_99 = false;
    if (bVar1) {
      Am_Object::Am_Object(local_40,local_18);
      local_41 = 1;
      Am_Object::Am_Object(&local_50,&Am_Command);
      bVar2 = true;
      local_99 = Am_Object::Is_Instance_Of(local_40,&local_50);
    }
  }
  if (bVar2) {
    Am_Object::~Am_Object(&local_50);
  }
  if ((local_41 & 1) != 0) {
    Am_Object::~Am_Object(local_40);
  }
  if ((local_21 & 1) != 0) {
    Am_Object::~Am_Object(&local_20);
  }
  if (local_99 == false) {
    bVar2 = Am_Object::Is_Part_Slot((Am_Object *)value_local,0xc5);
    if (bVar2) {
      Am_Object::Remove_Part((Am_Object *)value_local,0xc5);
    }
    Am_Object::Set((Am_Object *)value_local,0xc5,local_18,1);
    return;
  }
  Am_Object::Am_Object(&owner,local_18);
  Am_Object::Get_Owner(&local_68,(Am_Slot_Flags)&owner);
  bVar2 = Am_Object::operator==(&local_68,(Am_Object *)value_local);
  if (bVar2) {
    Am_Object::Get_Object(&local_70,(Am_Slot_Key)value_local,0xc5);
    bVar2 = Am_Object::operator==(&local_70,&owner);
    Am_Object::~Am_Object(&local_70);
    pAVar3 = value_local;
    if (bVar2) goto LAB_003275c0;
    Am_Object::Am_Object(&owners_cmd,&owner);
    Am_Object::Remove_Part((Am_Object *)pAVar3,&owners_cmd);
    Am_Object::~Am_Object(&owners_cmd);
  }
  else {
    bVar2 = Am_Object::Valid(&local_68);
    if (bVar2) {
      pAVar3 = Am_Object::Get(&local_68,0xa3,7);
      Am_Object::Am_Object(&local_88,pAVar3);
      bVar2 = Am_Object::operator!=(&local_88,&owner);
      if (bVar2) {
        Am_Object::Remove_From_Owner(&owner);
      }
      else {
        Am_Object::Create(&local_90,(char *)&owner);
        Am_Object::operator=(&owner,&local_90);
        Am_Object::~Am_Object(&local_90);
      }
      Am_Object::~Am_Object(&local_88);
    }
  }
  bVar2 = Am_Object::Is_Part_Slot((Am_Object *)value_local,0xc5);
  if (bVar2) {
    Am_Object::Remove_Part((Am_Object *)value_local,0xc5);
  }
  pAVar3 = value_local;
  Am_Object::Am_Object(&local_98,&owner);
  Am_Object::Set_Part((Am_Object *)pAVar3,0xc5,&local_98,1);
  Am_Object::~Am_Object(&local_98);
  pAVar3 = value_local;
  value_00 = Am_Object::operator_cast_to_Am_Wrapper_(&owner);
  Am_Object::Set((Am_Object *)pAVar3,0x1c6,value_00,1);
LAB_003275c0:
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&owner);
  return;
}

Assistant:

void
copy_item_to_command_proc(Am_Object &panel_item, const Am_Value &value)
{
  if (value.type == Am_OBJECT && Am_Object(value).Valid() &&
      Am_Object(value).Is_Instance_Of(Am_Command)) {
    // then is a command
    Am_Object command = value;
    Am_Object owner = command.Get_Owner(Am_NO_DEPENDENCY);
    if (owner == panel_item) {
      if (panel_item.Get_Object(Am_COMMAND, Am_NO_DEPENDENCY) == command)
        return; // already fine
      else
        panel_item.Remove_Part(command); // part of me in the wrong slot??
    } else if (owner.Valid()) {
      Am_Object owners_cmd =
          owner.Get(Am_ITEM, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
      if (owners_cmd != command) {
        //this can happen when the map re-shuffles the items due to a
        //new one being added or removed.  The map would remove command
        //from owner later.
        // std::cout << "Owner " << owner << " changing item from " << command
        //     << " to " << owners_cmd <<std::endl <<std::flush;
        command.Remove_From_Owner();
      } else // make new instance, leave command where it is
        command = command.Create();
    }
    if (panel_item.Is_Part_Slot(Am_COMMAND)) {
      // prevent deleting the prior command
      panel_item.Remove_Part(Am_COMMAND);
    }
    //Set_Part removes old value if any
    panel_item.Set_Part(Am_COMMAND, command, Am_OK_IF_NOT_THERE);
    panel_item.Set(Am_ATTACHED_COMMAND, command, Am_OK_IF_NOT_THERE);
  } else // not a command object, add to COMMAND slot as a value
  {
    if (panel_item.Is_Part_Slot(Am_COMMAND)) {
      // prevent deleting the prior command
      panel_item.Remove_Part(Am_COMMAND);
    }
    panel_item.Set(Am_COMMAND, value, Am_OK_IF_NOT_THERE);
  }
}